

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O0

void __thiscall TCV::TCV(TCV *this,ASTNode *root,STGV *_stgv)

{
  Detector *this_00;
  ASTNode *pAVar1;
  STGV *_stgv_local;
  ASTNode *root_local;
  TCV *this_local;
  
  Visitor::Visitor(&this->super_Visitor);
  (this->super_Visitor)._vptr_Visitor = (_func_int **)&PTR_visit_001a3ae0;
  this->shouldReturn = false;
  this->didReturn = false;
  std::__cxx11::string::string((string *)&this->returnType);
  std::__cxx11::string::string((string *)&this->currentFuncName);
  std::__cxx11::string::string((string *)&this->currentNamespace);
  this->stgv = _stgv;
  this->symbolTable = _stgv->symbolTable;
  this_00 = (Detector *)operator_new(0x48);
  (this_00->warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->memSizeCalculator = (MemSizeCalculator *)0x0;
  (this_00->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  this_00->symbolTable = (SymbolTable *)0x0;
  this_00->dependencyGraph = (DependencyGraph *)0x0;
  (this_00->warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Semantic::Detector::Detector(this_00);
  this->detector = this_00;
  pAVar1 = AST::ASTNode::getChild(root,0);
  (**pAVar1->_vptr_ASTNode)(pAVar1,this);
  return;
}

Assistant:

TCV::TCV(AST::ASTNode *root, STGV *_stgv) {
    this->stgv = _stgv;
    this->symbolTable = _stgv->symbolTable;
    this->detector = new Semantic::Detector();
    root->getChild(0)->accept(*this);
}